

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O0

int simplify_cond_branch(dmr_C *C,instruction *br,pseudo_t cond,instruction *def,pseudo_t *pp)

{
  pseudo_list *ppVar1;
  basic_block *false;
  basic_block *true;
  pseudo_t *pp_local;
  instruction *def_local;
  pseudo_t cond_local;
  instruction *br_local;
  dmr_C *C_local;
  
  dmrC_use_pseudo(C,br,*pp,&(br->field_5).target);
  remove_usage(C,cond,&(br->field_5).target);
  if (((undefined1  [64])*def & (undefined1  [64])0xff) == (undefined1  [64])0x19) {
    ppVar1 = (pseudo_list *)(br->field_6).field_1.bb_false;
    (br->field_6).field_1.bb_false = (basic_block *)(br->field_6).field_0.arg_list;
    (br->field_6).field_0.arg_list = ppVar1;
  }
  return 1;
}

Assistant:

static int simplify_cond_branch(struct dmr_C *C, struct instruction *br, pseudo_t cond, struct instruction *def, pseudo_t *pp)
{
	dmrC_use_pseudo(C, br, *pp, &br->cond);
	remove_usage(C, cond, &br->cond);
	if (def->opcode == OP_SET_EQ) {
		struct basic_block *true = br->bb_true;
		struct basic_block *false = br->bb_false;
		br->bb_false = true;
		br->bb_true = false;
	}
	return REPEAT_CSE;
}